

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O3

void __thiscall brdf_plot::setup_camera(brdf_plot *this)

{
  mat<4,_4,_float,_(glm::precision)0> Result;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_90;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  *(undefined8 *)&(this->_sphere_origin).field_0 = 0;
  *(undefined8 *)((long)&(this->_sphere_origin).field_0 + 8) = 0x3f80000000000000;
  *(undefined8 *)&(this->_eye_position).field_0 = 0x3f315cacbf315cac;
  *(undefined8 *)((long)&(this->_eye_position).field_0 + 8) = 0x3f315cac;
  *(undefined8 *)((long)&(this->_eye_target).field_0 + 4) = 0;
  local_90._0_8_ = 0x3ed105ebbf3504f3;
  local_80 = 0xbed105ebbf3504f3;
  local_70 = 0x3f5105eb00000000;
  local_90._8_8_ = 0xbf13cd3a;
  local_78 = 0x3f13cd3a;
  local_68 = 0x3f13cd3a;
  local_60 = 0x8000000080000000;
  uStack_58 = 0x3f800000bf999999;
  glm::detail::compute_inverse<glm::mat,_4,_4,_float,_(glm::precision)0,_false>::call
            ((mat<4,_4,_float,_(glm::precision)0> *)&local_90.field_0);
  *(undefined8 *)&(this->_view_matrix_inv).value[3].field_0 = local_20;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[3].field_0 + 8) = uStack_18;
  *(undefined8 *)&(this->_view_matrix_inv).value[2].field_0 = local_30;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[2].field_0 + 8) = uStack_28;
  *(undefined8 *)&(this->_view_matrix_inv).value[1].field_0 = local_40;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[1].field_0 + 8) = uStack_38;
  *(undefined8 *)&(this->_view_matrix_inv).value[0].field_0 = local_50;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[0].field_0 + 8) = uStack_48;
  return;
}

Assistant:

void brdf_plot::setup_camera()
{
  _sphere_origin = {0.0, 0.0f, 0.0f};
  _sphere_radius = 1.0f;

  _eye_position = 1.2f * glm::normalize(glm::vec3{-1.0f, 1.0f, 1.0f});
  _eye_target = {0.0f, 0.0f, 0.0f};

  glm::vec3 up_vector{0.0f, 0.0f, 1.0f};
  glm::mat4 view_matrix = glm::lookAt(_eye_position, _sphere_origin, up_vector);

  _view_matrix_inv = glm::inverse(view_matrix);
}